

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllContentModel.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::AllContentModel::validateContentSpecial
          (AllContentModel *this,QName **children,XMLSize_t childCount,uint param_3,
          GrammarResolver *pGrammarResolver,XMLStringPool *pStringPool,XMLSize_t *indexFailingChild,
          MemoryManager *manager)

{
  QName *anElement;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  XMLSize_t XVar7;
  ArrayJanitor<bool> jan;
  SubstitutionGroupComparator comparator;
  ulong local_68;
  ArrayJanitor<bool> local_58;
  QName **local_48;
  SubstitutionGroupComparator local_40;
  bool *pbVar3;
  
  if (childCount == 0) {
    uVar5 = this->fNumRequired;
    if (uVar5 == 0 || this->fHasOptionalContent != false) {
      return true;
    }
    local_68 = 0;
  }
  else {
    local_48 = children;
    local_40.fGrammarResolver = pGrammarResolver;
    local_40.fStringPool = pStringPool;
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,this->fCount);
    pbVar3 = (bool *)CONCAT44(extraout_var,iVar2);
    local_58.fMemoryManager = manager;
    uVar4 = this->fCount;
    for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      pbVar3[uVar6] = false;
    }
    local_68 = 0;
    local_58.fData = pbVar3;
    for (XVar7 = 0; XVar7 != childCount; XVar7 = XVar7 + 1) {
      anElement = local_48[XVar7];
      if ((this->fIsMixed != true) || (anElement->fURIId != 0xffffffff)) {
        for (uVar6 = 0; uVar6 < uVar4; uVar6 = uVar6 + 1) {
          bVar1 = SubstitutionGroupComparator::isEquivalentTo
                            (&local_40,anElement,this->fChildren[uVar6]);
          if (bVar1) {
            if (pbVar3[uVar6] != false) goto LAB_002e08f4;
            pbVar3[uVar6] = true;
            uVar4 = this->fCount;
            local_68 = local_68 + ((ulong)this->fChildOptional[uVar6] ^ 1);
            break;
          }
          uVar4 = this->fCount;
        }
        if (uVar4 == uVar6) {
LAB_002e08f4:
          *indexFailingChild = XVar7;
          ArrayJanitor<bool>::~ArrayJanitor(&local_58);
          goto LAB_002e0937;
        }
      }
    }
    ArrayJanitor<bool>::~ArrayJanitor(&local_58);
    uVar5 = this->fNumRequired;
  }
  bVar1 = true;
  if (local_68 != uVar5) {
    *indexFailingChild = childCount;
LAB_002e0937:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AllContentModel::validateContentSpecial(QName** const          children
                                          , XMLSize_t               childCount
                                          , unsigned int
                                          , GrammarResolver*  const pGrammarResolver
                                          , XMLStringPool*    const pStringPool
                                          , XMLSize_t*              indexFailingChild
                                          , MemoryManager*    const manager) const
{
    // If <all> had minOccurs of zero and there are
    // no children to validate, trivially validate
    if (childCount == 0 && (fHasOptionalContent || !fNumRequired))
        return true;

    // keep track of the required element seen
    XMLSize_t numRequiredSeen = 0;

    if(childCount > 0)
    {
        SubstitutionGroupComparator comparator(pGrammarResolver, pStringPool);

        // Check for duplicate element
        bool* elementSeen = (bool*) manager->allocate(fCount*sizeof(bool)); //new bool[fCount];

        const ArrayJanitor<bool> jan(elementSeen, manager);

        // initialize the array
        for (XMLSize_t i = 0; i < fCount; i++)
            elementSeen[i] = false;

        for (XMLSize_t outIndex = 0; outIndex < childCount; outIndex++) {
            // Get the current child out of the source index
            QName* const curChild = children[outIndex];

            // If it's PCDATA, then we just accept that
            if (fIsMixed && curChild->getURI() == XMLElementDecl::fgPCDataElemId)
                continue;

            // And try to find it in our list
            XMLSize_t inIndex = 0;
            for (; inIndex < fCount; inIndex++)
            {
                QName* const inChild = fChildren[inIndex];
                if ( comparator.isEquivalentTo(curChild, inChild)) {
                    // match
                    // If this element was seen already, indicate an error was
                    // found at the duplicate index.
                    if (elementSeen[inIndex]) {
                        *indexFailingChild=outIndex;
                        return false;
                    }
                    else
                        elementSeen[inIndex] = true;

                    if (!fChildOptional[inIndex])
                        numRequiredSeen++;

                    break;
                }
            }

            // We did not find this one, so the validation failed
            if (inIndex == fCount) {
                *indexFailingChild=outIndex;
                return false;
            }

        }
    }

    // Were all the required elements of the <all> encountered?
    if (numRequiredSeen != fNumRequired) {
        *indexFailingChild=childCount;
        return false;
    }

    // Everything seems to be ok, so return success
    return true;

}